

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemoryCopyExpr
          (BinaryReaderIR *this,Index srcmemidx,Index destmemidx)

{
  char *pcVar1;
  Offset OVar2;
  Result RVar3;
  tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_> tVar4;
  Location loc_1;
  Location loc;
  __uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_> local_1a0;
  Location local_198;
  Location local_178;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  local_178.field_1.field_0.line = 0;
  local_178.field_1.field_0.first_column = 0;
  local_178.field_1.field_0.last_column = 0;
  local_178.filename._M_len = 0;
  local_178.filename._M_str._0_4_ = 0;
  local_178.filename._M_str._4_4_ = 0;
  pcVar1 = this->filename_;
  local_178.filename._M_len = strlen(pcVar1);
  local_178.filename._M_str._0_4_ = SUB84(pcVar1,0);
  local_178.filename._M_str._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_178.field_1.field_0.line = (int)OVar2;
  local_178.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  Var::Var(&local_108,srcmemidx,&local_178);
  local_198.field_1.field_0.line = 0;
  local_198.field_1.field_0.first_column = 0;
  local_198.field_1.field_0.last_column = 0;
  local_198.filename._M_len = 0;
  local_198.filename._M_str._0_4_ = 0;
  local_198.filename._M_str._4_4_ = 0;
  pcVar1 = this->filename_;
  local_198.filename._M_len = strlen(pcVar1);
  local_198.filename._M_str._0_4_ = SUB84(pcVar1,0);
  local_198.filename._M_str._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_198.field_1.field_0.line = (int)OVar2;
  local_198.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  Var::Var(&local_150,destmemidx,&local_198);
  tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)operator_new(0xd0);
  Var::Var(&local_78,&local_108);
  Var::Var(&local_c0,&local_150);
  *(undefined8 *)
   ((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x24) = 0;
  *(undefined8 *)
   ((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x2c) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x20) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined4 *)
   ((long)tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x38) = 0x1c;
  *(undefined ***)
   tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
   super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = &PTR__MemoryBinaryExpr_001d3060;
  Var::Var((Var *)((long)tVar4.
                         super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                         super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x40),&local_78);
  Var::Var((Var *)((long)tVar4.
                         super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                         super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x88),&local_c0);
  Var::~Var(&local_c0);
  Var::~Var(&local_78);
  local_1a0._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       tVar4.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  RVar3 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_1a0);
  if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
      local_1a0._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_1a0._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
  local_1a0._M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (tuple<wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
       (_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)0x0;
  Var::~Var(&local_150);
  Var::~Var(&local_108);
  return (Result)RVar3.enum_;
}

Assistant:

Result BinaryReaderIR::OnMemoryCopyExpr(Index srcmemidx, Index destmemidx) {
  return AppendExpr(std::make_unique<MemoryCopyExpr>(
      Var(srcmemidx, GetLocation()), Var(destmemidx, GetLocation())));
}